

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  undefined1 auVar4 [8];
  uint uVar5;
  GLuint GVar6;
  GLuint GVar7;
  int iVar8;
  char *pcVar9;
  long *plVar10;
  int i;
  long lVar11;
  long *plVar12;
  uint __val;
  long lVar13;
  GLuint *__return_storage_ptr__;
  ostream *poVar14;
  undefined4 *puVar15;
  undefined4 extraout_XMM0_Db;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Vec3<float> VVar20;
  Vec3<float> color_00;
  Vec3<float> color_01;
  Vec3<float> vec;
  Cube local_608 [8];
  undefined8 uStack_480;
  char *pcStack_478;
  char *skybox_textures [6];
  Vec3<float> cube_positions [9];
  char *pcStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined4 local_390;
  undefined8 local_38c;
  undefined8 uStack_384;
  undefined8 local_37c;
  undefined8 uStack_374;
  undefined1 local_368 [8];
  Model mainModel;
  Model floorModel;
  undefined1 local_288 [8];
  SkyBox skybox;
  undefined1 local_230 [8];
  ZRender zrender;
  Vec3<float> atten_vec [9];
  GLuint GStack_194;
  Mat4<float,_void> local_148;
  GLuint local_104;
  undefined1 local_100 [8];
  Renderer render;
  undefined1 auStack_b0 [8];
  double xPos;
  long local_a0;
  long lStack_98;
  size_type *local_70;
  string __str;
  double yPos;
  long local_40;
  long lStack_38;
  Vec3<float> color;
  
  uStack_480 = 0x10a17b;
  Render::CreateRenderer((Renderer *)local_100,state.screen_width,state.screen_height);
  skybox_textures[5] = (char *)0x1a;
  cube_positions[0].field_0._0_8_ = anon_var_dwarf_3870;
  stack0xfffffffffffffc28 = 0x1c;
  pcStack_3d0 = "./shader/model-fragment.glsl";
  uStack_480 = 0x10a1c2;
  ShaderProgram::ShaderProgram
            ((ShaderProgram *)&zrender.colorFBO,(string_view *)(skybox_textures + 5),
             (string_view *)((long)&cube_positions[8].field_0 + 8));
  render.shader_program.shader_program = atten_vec[0].field_0.field_0.r;
  render.vbo_offset = zrender.colorFBO;
  render.max_allocated = zrender.activeDepth;
  skybox_textures[5] = (char *)0x1f;
  cube_positions[0].field_0._0_8_ = anon_var_dwarf_38a7;
  stack0xfffffffffffffc28 = 0x21;
  pcStack_3d0 = "./shader/light-cube-fragment.glsl";
  uStack_480 = 0x10a219;
  ShaderProgram::ShaderProgram
            ((ShaderProgram *)&zrender.colorFBO,(string_view *)(skybox_textures + 5),
             (string_view *)((long)&cube_positions[8].field_0 + 8));
  render.light_cube_shader_program.shader_program = atten_vec[0].field_0.field_0.r;
  render.shader_program.vertex_shader = zrender.colorFBO;
  render.shader_program.fragment_shader = zrender.activeDepth;
  skybox_textures[5] = (char *)0x1b;
  cube_positions[0].field_0._0_8_ = anon_var_dwarf_38d5;
  stack0xfffffffffffffc28 = 0x1d;
  pcStack_3d0 = "./shader/skybox-fragment.glsl";
  uStack_480 = 0x10a263;
  ShaderProgram::ShaderProgram
            ((ShaderProgram *)&zrender.colorFBO,(string_view *)(skybox_textures + 5),
             (string_view *)((long)&cube_positions[8].field_0 + 8));
  render.skybox_shader_program.shader_program = atten_vec[0].field_0.field_0.r;
  render.light_cube_shader_program.vertex_shader = zrender.colorFBO;
  render.light_cube_shader_program.fragment_shader = zrender.activeDepth;
  uStack_480 = 0x10a27b;
  stbi_set_flip_vertically_on_load(1);
  uStack_480 = 0x10a28e;
  Model::Model((Model *)local_368,"./Models/Final/rocket.obj");
  uStack_480 = 0x10a2a1;
  Model::Model((Model *)((long)&mainModel.directory.field_2 + 8),"./Models/Final/Floor/floor.obj");
  skybox_textures[5] = (char *)0x3ff71023400c454e;
  cube_positions[0].field_0._0_8_ = 0x400a3bf740101744;
  cube_positions._8_8_ = 0xbfca0e953ff2d384;
  cube_positions[1].field_0._4_8_ = 0x40a099ed3fa98d7a;
  cube_positions[2].field_0._0_8_ = 0xbf3f33ec4026a79c;
  cube_positions._32_8_ = 0x4009d36f3ff33f53;
  cube_positions[3].field_0._4_8_ = 0x3ff86152bf3482cf;
  cube_positions[4].field_0._0_8_ = 0x40c00000bfc53fd1;
  cube_positions._56_8_ = 0xc0c000003ee66666;
  cube_positions[5].field_0._4_8_ = 0x3ee66666c0c00000;
  cube_positions[6].field_0._0_8_ = 0xc0c0000040c00000;
  cube_positions._80_8_ = 0xc0c000003ee66666;
  cube_positions[7].field_0._4_8_ = 0x3ee6666640c00000;
  stack0xfffffffffffffc28 = 0x3f8000003f800000;
  pcStack_3d0 = (char *)0x3f800000;
  local_3c8 = 0x3e4ccccd;
  uStack_3c0 = 0x3f8000003f800000;
  local_3b8 = 0x3f8000003f800000;
  uStack_3b0 = 0;
  local_3a8 = 0x3f8000003f800000;
  uStack_3a0 = 0x3f8000003f800000;
  local_398 = 0x3f80000000000000;
  cube_positions[8].field_0.field_0.r = 6.0;
  local_390 = 0x3f800000;
  local_38c = 0;
  uStack_384 = 0;
  local_37c = 0x3f8000003f800000;
  uStack_374 = 0x3f800000;
  lVar13 = 0;
  do {
    Cube::Cube((Cube *)((long)local_608 + lVar13));
    lVar13 = lVar13 + 0x2c;
  } while (lVar13 != 0x18c);
  lVar13 = (long)local_608 + 0x1c;
  lVar11 = 0;
  do {
    *(undefined4 *)(lVar13 + 0xfffffffffffffff0) =
         *(undefined4 *)((long)&cube_positions[0].field_0 + lVar11);
    *(undefined8 *)(lVar13 + 0xffffffffffffffe8) =
         *(undefined8 *)((long)skybox_textures + lVar11 + 0x28);
    *(undefined8 *)(lVar13 + 0xfffffffffffffff4) = 0x3da3d70a3da3d70a;
    *(undefined4 *)(lVar13 + 0xfffffffffffffffc) = 0x3da3d70a;
    *(undefined8 *)lVar13 = *(undefined8 *)((long)&cube_positions[8].field_0 + lVar11 + 8);
    *(undefined4 *)(lVar13 + 8) = *(undefined4 *)((long)&pcStack_3d0 + lVar11);
    lVar11 = lVar11 + 0xc;
    lVar13 = lVar13 + 0x2c;
  } while (lVar11 != 0x6c);
  Render::ZRender::ZRender((ZRender *)local_230,state.screen_width,state.screen_height);
  GVar6 = (*glad_glCreateProgram)();
  zrender.colorFBO = 0x15;
  zrender.activeDepth = 0;
  atten_vec[0].field_0._0_8_ = anon_var_dwarf_3931;
  GVar7 = CompileAndLogShader((string_view *)&zrender.colorFBO,0x8b31);
  (*glad_glAttachShader)(GVar6,GVar7);
  Render::ZRender::attachDepthFragment((ZRender *)local_230,GVar6);
  skybox_textures[3] = "./resources/skybox/back.png";
  skybox_textures[4] = "./resources/skybox/front.png";
  skybox_textures[1] = "./resources/skybox/top.png";
  skybox_textures[2] = "./resources/skybox/bottom.png";
  pcStack_478 = "./resources/skybox/right.png";
  skybox_textures[0] = "./resources/skybox/left.png";
  SkyBox::SkyBox((SkyBox *)local_288);
  SkyBox::load_skybox_textures((SkyBox *)local_288,&pcStack_478);
  (*glad_glUseProgram)(render.light_cube_shader_program.vertex_shader);
  update_uniform_1i("skybox",render.light_cube_shader_program.vertex_shader,0);
  local_148.elements[3][0] = 0.0;
  local_148.elements[3][1] = 0.0;
  local_148.elements[3][2] = 0.0;
  local_148.elements[3][3] = 0.0;
  local_148.elements[2][0] = 0.0;
  local_148.elements[2][1] = 0.0;
  local_148.elements[2][2] = 0.0;
  local_148.elements[2][3] = 0.0;
  local_148.elements[1][0] = 0.0;
  local_148.elements[1][1] = 0.0;
  local_148.elements[1][2] = 0.0;
  local_148.elements[1][3] = 0.0;
  local_148.elements[0][0] = 0.0;
  local_148.elements[0][1] = 0.0;
  local_148.elements[0][2] = 0.0;
  local_148.elements[0][3] = 0.0;
  lVar13 = 0;
  do {
    *(undefined4 *)((long)local_148.elements[0] + lVar13) = 0x3f800000;
    lVar13 = lVar13 + 0x14;
  } while (lVar13 != 0x50);
  floorModel.directory.field_2._8_8_ = 0;
  lVar13 = 0;
  do {
    *(undefined4 *)((long)&floorModel.directory.field_2 + lVar13 + 8) = 0x3f800000;
    lVar13 = lVar13 + 0x14;
  } while (lVar13 != 0x50);
  stack0xfffffffffffffe68 = 0;
  FMath::Mat4<float,_void>::translate
            ((Mat4<float,_void> *)&zrender.colorFBO,&local_148,
             (Vec3<float> *)((long)&atten_vec[8].field_0 + 8));
  __return_storage_ptr__ = &zrender.colorFBO;
  local_148.elements[3][0] = (float)atten_vec[3].field_0._4_4_;
  local_148.elements[3][1] = (float)atten_vec[3].field_0._8_4_;
  local_148.elements[3][2] = (float)atten_vec[4].field_0._0_4_;
  local_148.elements[3][3] = (float)atten_vec[4].field_0._4_4_;
  local_148.elements[2][0] = (float)atten_vec[2].field_0._0_4_;
  local_148.elements[2][1] = (float)atten_vec[2].field_0._4_4_;
  local_148.elements[2]._8_8_ = atten_vec._32_8_;
  local_148.elements[1]._0_8_ = atten_vec._8_8_;
  local_148.elements[1][2] = (float)atten_vec[1].field_0._4_4_;
  local_148.elements[1][3] = (float)atten_vec[1].field_0._8_4_;
  local_148.elements[0][0] = (float)zrender.colorFBO;
  local_148.elements[0][1] = (float)zrender.activeDepth;
  local_148.elements[0][2] = (float)atten_vec[0].field_0._0_4_;
  local_148.elements[0][3] = (float)atten_vec[0].field_0._4_4_;
  stack0xfffffffffffffe68 = 0x3e4ccccd3e4ccccd;
  FMath::Mat4<float,_void>::scale
            ((Mat4<float,_void> *)__return_storage_ptr__,&local_148,
             (Vec3<float> *)((long)&atten_vec[8].field_0 + 8));
  local_148.elements[3][0] = (float)atten_vec[3].field_0._4_4_;
  local_148.elements[3][1] = (float)atten_vec[3].field_0._8_4_;
  local_148.elements[3][2] = (float)atten_vec[4].field_0._0_4_;
  local_148.elements[3][3] = (float)atten_vec[4].field_0._4_4_;
  local_148.elements[2][0] = (float)atten_vec[2].field_0._0_4_;
  local_148.elements[2][1] = (float)atten_vec[2].field_0._4_4_;
  local_148.elements[2]._8_8_ = atten_vec._32_8_;
  local_148.elements[1]._0_8_ = atten_vec._8_8_;
  local_148.elements[1][2] = (float)atten_vec[1].field_0._4_4_;
  local_148.elements[1][3] = (float)atten_vec[1].field_0._8_4_;
  local_148.elements[0][0] = (float)zrender.colorFBO;
  local_148.elements[0][1] = (float)zrender.activeDepth;
  uVar3 = local_148.elements[0]._0_8_;
  local_148.elements[0][2] = (float)atten_vec[0].field_0._0_4_;
  local_148.elements[0][3] = (float)atten_vec[0].field_0._4_4_;
  local_148.elements[0][0] = zrender.colorFBO;
  pcVar9 = floorModel.directory.field_2._M_local_buf + 8;
  floorModel.directory.field_2._8_4_ = 1.0 / local_148.elements[0][0];
  atten_vec[3].field_0._4_8_ = 0;
  atten_vec[4].field_0._0_8_ = 0;
  atten_vec[2].field_0._0_8_ = 0;
  atten_vec._32_8_ = 0;
  atten_vec._8_8_ = 0;
  atten_vec[1].field_0._4_8_ = 0;
  zrender.colorFBO = 0;
  zrender.activeDepth = 0;
  atten_vec[0].field_0._0_8_ = 0;
  lVar13 = 0;
  local_148.elements[0]._0_8_ = uVar3;
  do {
    lVar11 = 0;
    do {
      *(undefined4 *)((long)__return_storage_ptr__ + lVar11) = *(undefined4 *)(pcVar9 + lVar11 * 4);
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x10);
    lVar13 = lVar13 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 4;
    pcVar9 = pcVar9 + 4;
  } while (lVar13 != 4);
  floorModel.directory.field_2._8_4_ = zrender.colorFBO;
  floorModel.directory.field_2._12_4_ = zrender.activeDepth;
  stack0xfffffffffffffe68 = 0;
  lVar13 = 0;
  do {
    *(undefined4 *)((long)&atten_vec[8].field_0 + lVar13 + 8) = 0x3f800000;
    lVar13 = lVar13 + 0x14;
  } while (lVar13 != 0x50);
  FMath::Mat4<float,_void>::perspective
            ((Mat4<float,_void> *)&zrender.colorFBO,
             (Mat4<float,_void> *)((long)&atten_vec[8].field_0 + 8),1.0,30.0,0.01,100.0);
  atten_vec[8].field_0._8_4_ = zrender.colorFBO;
  GStack_194 = zrender.activeDepth;
  (*glad_glEnable)(0xb44);
  std::chrono::_V2::steady_clock::now();
  zrender.colorFBO = 0x3f800000;
  zrender.activeDepth = 0x3ee147ae;
  atten_vec[0].field_0._0_8_ = 0x3f8000003eb33333;
  atten_vec._8_8_ = 0x3eb333333ee147ae;
  atten_vec[1].field_0._4_8_ = 0x3ee147ae3f800000;
  atten_vec[2].field_0._0_8_ = 0x3f8000003eb33333;
  atten_vec._32_8_ = 0x3eb333333ee147ae;
  atten_vec[3].field_0._4_8_ = 0x3ee147ae3f800000;
  atten_vec[4].field_0._0_8_ = 0x3dcccccd3eb33333;
  atten_vec._56_8_ = 0x3dcccccd3dcccccd;
  atten_vec[5].field_0._4_8_ = 0x3dcccccd3dcccccd;
  atten_vec[6].field_0._0_8_ = 0x3dcccccd3dcccccd;
  atten_vec._80_8_ = 0x3dcccccd3dcccccd;
  atten_vec[7].field_0._4_8_ = 0x3dcccccd3dcccccd;
  atten_vec[8].field_0.field_0.r = 0.1;
  local_104 = GVar6;
  while( true ) {
    iVar8 = glfwWindowShouldClose((GLFWwindow *)local_100);
    if (iVar8 != 0) break;
    (*glad_glBindFramebuffer)(0x8d40,zrender.colorBuffer);
    (*glad_glClearColor)(0.25,0.25,0.25,1.0);
    (*glad_glClear)(0x4000);
    (*glad_glBindFramebuffer)(0x8d40,0);
    Render::ZRender::clearDepth((ZRender *)local_230);
    (*glad_glUseProgram)(render.vbo_offset);
    skybox.texture_ID = 0;
    skybox.number_of_textures = 0;
    lVar13 = 0;
    do {
      *(undefined4 *)((long)&skybox.texture_ID + lVar13) = 0x3f800000;
      lVar13 = lVar13 + 0x14;
    } while (lVar13 != 0x50);
    Camera::ViewMatrix((Mat4<float,_void> *)auStack_b0,&state.camera);
    skybox.texture_ID = auStack_b0._0_4_;
    skybox.number_of_textures = auStack_b0._4_4_;
    VVar20.field_0.field_0.b = state.camera.camera_pos.field_0.field_0.b;
    VVar20.field_0._0_8_ = state.camera.camera_pos.field_0._0_8_;
    update_uniform_3f("viewPos",render.vbo_offset,VVar20);
    render.skybox_shader_program._4_8_ = atten_vec;
    lVar13 = 0;
    puVar15 = (undefined4 *)((long)local_608 + 0x24);
    do {
      local_70 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
      __val = (uint)lVar13;
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,1,__val);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x135325);
      __str.field_2._8_8_ = &local_40;
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_40 = *plVar12;
        lStack_38 = plVar10[3];
      }
      else {
        local_40 = *plVar12;
        __str.field_2._8_8_ = (long *)*plVar10;
      }
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
      auStack_b0 = (undefined1  [8])&local_a0;
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_a0 = *plVar12;
        lStack_98 = plVar10[3];
      }
      else {
        auStack_b0 = (undefined1  [8])*plVar10;
        local_a0 = *plVar12;
      }
      xPos = (double)plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      update_uniform_3f((char *)auStack_b0,render.vbo_offset,
                        (Vec3<float>)
                        ((anon_union_12_3_e2189aaa_for_Vec3<float>_1 *)(puVar15 + -8))->field_0);
      if (auStack_b0 != (undefined1  [8])&local_a0) {
        operator_delete((void *)auStack_b0,local_a0 + 1);
      }
      if ((long *)__str.field_2._8_8_ != &local_40) {
        operator_delete((void *)__str.field_2._8_8_,local_40 + 1);
      }
      if (local_70 != &__str._M_string_length) {
        operator_delete(local_70,__str._M_string_length + 1);
      }
      local_70 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,1,__val);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x135325);
      __str.field_2._8_8_ = &local_40;
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_40 = *plVar12;
        lStack_38 = plVar10[3];
      }
      else {
        local_40 = *plVar12;
        __str.field_2._8_8_ = (long *)*plVar10;
      }
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
      auStack_b0 = (undefined1  [8])&local_a0;
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_a0 = *plVar12;
        lStack_98 = plVar10[3];
      }
      else {
        auStack_b0 = (undefined1  [8])*plVar10;
        local_a0 = *plVar12;
      }
      auVar4 = auStack_b0;
      xPos = (double)plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      uVar5 = render.vbo_offset;
      color.field_0.field_0.b = (float)*puVar15;
      color.field_0._0_8_ = *(undefined8 *)(puVar15 + -2);
      VVar20 = ambient(color);
      update_uniform_3f((char *)auVar4,uVar5,VVar20);
      if (auStack_b0 != (undefined1  [8])&local_a0) {
        operator_delete((void *)auStack_b0,local_a0 + 1);
      }
      if ((long *)__str.field_2._8_8_ != &local_40) {
        operator_delete((void *)__str.field_2._8_8_,local_40 + 1);
      }
      if (local_70 != &__str._M_string_length) {
        operator_delete(local_70,__str._M_string_length + 1);
      }
      local_70 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,1,__val);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x135325);
      __str.field_2._8_8_ = &local_40;
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_40 = *plVar12;
        lStack_38 = plVar10[3];
      }
      else {
        local_40 = *plVar12;
        __str.field_2._8_8_ = (long *)*plVar10;
      }
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
      auStack_b0 = (undefined1  [8])&local_a0;
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_a0 = *plVar12;
        lStack_98 = plVar10[3];
      }
      else {
        auStack_b0 = (undefined1  [8])*plVar10;
        local_a0 = *plVar12;
      }
      auVar4 = auStack_b0;
      xPos = (double)plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      uVar5 = render.vbo_offset;
      color_00.field_0.field_0.b = (float)*puVar15;
      color_00.field_0._0_8_ = *(undefined8 *)(puVar15 + -2);
      VVar20 = diffuse(color_00);
      update_uniform_3f((char *)auVar4,uVar5,VVar20);
      if (auStack_b0 != (undefined1  [8])&local_a0) {
        operator_delete((void *)auStack_b0,local_a0 + 1);
      }
      if ((long *)__str.field_2._8_8_ != &local_40) {
        operator_delete((void *)__str.field_2._8_8_,local_40 + 1);
      }
      if (local_70 != &__str._M_string_length) {
        operator_delete(local_70,__str._M_string_length + 1);
      }
      local_70 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,1,__val);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x135325);
      __str.field_2._8_8_ = &local_40;
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_40 = *plVar12;
        lStack_38 = plVar10[3];
      }
      else {
        local_40 = *plVar12;
        __str.field_2._8_8_ = (long *)*plVar10;
      }
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
      auStack_b0 = (undefined1  [8])&local_a0;
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_a0 = *plVar12;
        lStack_98 = plVar10[3];
      }
      else {
        auStack_b0 = (undefined1  [8])*plVar10;
        local_a0 = *plVar12;
      }
      auVar4 = auStack_b0;
      xPos = (double)plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      uVar5 = render.vbo_offset;
      color_01.field_0.field_0.b = (float)*puVar15;
      color_01.field_0._0_8_ = *(undefined8 *)(puVar15 + -2);
      VVar20 = specular(color_01);
      update_uniform_3f((char *)auVar4,uVar5,VVar20);
      if (auStack_b0 != (undefined1  [8])&local_a0) {
        operator_delete((void *)auStack_b0,local_a0 + 1);
      }
      pcVar9 = __str.field_2._M_local_buf + 8;
      if ((long *)__str.field_2._8_8_ != &local_40) {
        operator_delete((void *)__str.field_2._8_8_,local_40 + 1);
      }
      if (local_70 != &__str._M_string_length) {
        operator_delete(local_70,__str._M_string_length + 1);
      }
      local_70 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,1,__val);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x135325);
      __str.field_2._8_8_ = &local_40;
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_40 = *plVar12;
        lStack_38 = plVar10[3];
      }
      else {
        local_40 = *plVar12;
        __str.field_2._8_8_ = (long *)*plVar10;
      }
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(pcVar9);
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_a0 = *plVar12;
        lStack_98 = plVar10[3];
        auStack_b0 = (undefined1  [8])&local_a0;
      }
      else {
        local_a0 = *plVar12;
        auStack_b0 = (undefined1  [8])*plVar10;
      }
      xPos = (double)plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      update_uniform_1f((char *)auStack_b0,render.vbo_offset,
                        *(float *)(render.skybox_shader_program._4_8_ + -8));
      if (auStack_b0 != (undefined1  [8])&local_a0) {
        operator_delete((void *)auStack_b0,local_a0 + 1);
      }
      if ((long *)__str.field_2._8_8_ != &local_40) {
        operator_delete((void *)__str.field_2._8_8_,local_40 + 1);
      }
      if (local_70 != &__str._M_string_length) {
        operator_delete(local_70,__str._M_string_length + 1);
      }
      local_70 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,1,__val);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x135325);
      __str.field_2._8_8_ = &local_40;
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_40 = *plVar12;
        lStack_38 = plVar10[3];
      }
      else {
        local_40 = *plVar12;
        __str.field_2._8_8_ = (long *)*plVar10;
      }
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(pcVar9);
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_a0 = *plVar12;
        lStack_98 = plVar10[3];
        auStack_b0 = (undefined1  [8])&local_a0;
      }
      else {
        local_a0 = *plVar12;
        auStack_b0 = (undefined1  [8])*plVar10;
      }
      xPos = (double)plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      update_uniform_1f((char *)auStack_b0,render.vbo_offset,
                        *(float *)(render.skybox_shader_program._4_8_ + -4));
      if (auStack_b0 != (undefined1  [8])&local_a0) {
        operator_delete((void *)auStack_b0,local_a0 + 1);
      }
      if ((long *)__str.field_2._8_8_ != &local_40) {
        operator_delete((void *)__str.field_2._8_8_,local_40 + 1);
      }
      if (local_70 != &__str._M_string_length) {
        operator_delete(local_70,__str._M_string_length + 1);
      }
      local_70 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,1,__val);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x135325);
      __str.field_2._8_8_ = &local_40;
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_40 = *plVar12;
        lStack_38 = plVar10[3];
      }
      else {
        local_40 = *plVar12;
        __str.field_2._8_8_ = (long *)*plVar10;
      }
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(pcVar9);
      plVar12 = plVar10 + 2;
      if ((long *)*plVar10 == plVar12) {
        local_a0 = *plVar12;
        lStack_98 = plVar10[3];
        auStack_b0 = (undefined1  [8])&local_a0;
      }
      else {
        local_a0 = *plVar12;
        auStack_b0 = (undefined1  [8])*plVar10;
      }
      xPos = (double)plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      update_uniform_1f((char *)auStack_b0,render.vbo_offset,
                        *(float *)render.skybox_shader_program._4_8_);
      if (auStack_b0 != (undefined1  [8])&local_a0) {
        operator_delete((void *)auStack_b0,local_a0 + 1);
      }
      if ((long *)__str.field_2._8_8_ != &local_40) {
        operator_delete((void *)__str.field_2._8_8_,local_40 + 1);
      }
      if (local_70 != &__str._M_string_length) {
        operator_delete(local_70,__str._M_string_length + 1);
      }
      lVar13 = lVar13 + 1;
      render.skybox_shader_program._4_8_ = render.skybox_shader_program._4_8_ + 0xc;
      puVar15 = puVar15 + 0xb;
    } while (lVar13 != 9);
    (*glad_glUseProgram)(render.vbo_offset);
    GVar6 = local_104;
    update_uniform_matrix_4f("model",render.vbo_offset,(float *)&local_148);
    update_uniform_matrix_4f
              ("inv_model",render.vbo_offset,(float *)((long)&floorModel.directory.field_2 + 8));
    update_uniform_matrix_4f("projection",render.vbo_offset,&atten_vec[8].field_0.field_0.b);
    update_uniform_matrix_4f("view",render.vbo_offset,(float *)&skybox.texture_ID);
    (*glad_glUseProgram)(GVar6);
    update_uniform_matrix_4f("model",GVar6,(float *)&local_148);
    update_uniform_matrix_4f("projection",GVar6,&atten_vec[8].field_0.field_0.b);
    update_uniform_matrix_4f("view",GVar6,(float *)&skybox.texture_ID);
    (*glad_glUseProgram)(render.light_cube_shader_program.vertex_shader);
    update_uniform_matrix_4f
              ("projection",render.light_cube_shader_program.vertex_shader,
               &atten_vec[8].field_0.field_0.b);
    update_uniform_matrix_4f
              ("view",render.light_cube_shader_program.vertex_shader,(float *)&skybox.texture_ID);
    (*glad_glBindFramebuffer)(0x8d40,zrender.colorBuffer);
    SkyBox::draw_skybox((SkyBox *)local_288);
    (*glad_glUseProgram)(GVar6);
    Render::ZRender::clearDepth((ZRender *)local_230);
    Model::draw_model((Model *)local_368,render.vbo_offset,GVar6,(ZRender *)local_230);
    Model::draw_model((Model *)((long)&mainModel.directory.field_2 + 8),render.vbo_offset,GVar6,
                      (ZRender *)local_230);
    Render::ZRender::draw((ZRender *)local_230);
    auVar4 = local_100;
    glfwGetCursorPos((GLFWwindow *)local_100,(double *)auStack_b0,
                     (double *)((long)&__str.field_2 + 8));
    if (state.first_mouse == true) {
      state.first_mouse = false;
      dVar2 = 0.0;
      dVar1 = 0.0;
    }
    else {
      dVar1 = state.last_xpos - (double)auStack_b0;
      dVar2 = (double)__str.field_2._8_8_ - state.last_ypos;
    }
    state.last_xpos = (double)auStack_b0;
    state.last_ypos = (double)__str.field_2._8_8_;
    state.pitch = (float)((double)state.pitch - dVar2 * 0.001);
    state.yaw = (float)((double)state.yaw - dVar1 * 0.001);
    fVar17 = 1.5;
    if ((1.5 < state.pitch) || (fVar17 = -1.5, state.pitch < -1.5)) {
      state.pitch = fVar17;
    }
    fVar17 = sinf(state.yaw);
    render.skybox_shader_program.vertex_shader = (GLuint)fVar17;
    fVar17 = cosf(state.pitch);
    state.camera.camera_front.field_0.field_0.r =
         fVar17 * (float)render.skybox_shader_program.vertex_shader;
    fVar17 = sinf(state.pitch);
    state.camera.camera_front.field_0.field_0.g = fVar17;
    fVar17 = cosf(state.pitch);
    render.skybox_shader_program._4_8_ = CONCAT44(extraout_XMM0_Db,fVar17) ^ 0x8000000080000000;
    fVar17 = cosf(state.yaw);
    state.camera.camera_front.field_0.field_0.b =
         fVar17 * (float)render.skybox_shader_program.vertex_shader;
    fVar17 = FMath::Vec3<float>::norm((Vec3<float> *)&state);
    fVar16 = 0.0;
    if ((fVar17 != 0.0) || (NAN(fVar17))) {
      fVar18 = (float)state.camera.camera_front.field_0._0_8_ / fVar17;
      fVar19 = (float)((ulong)state.camera.camera_front.field_0._0_8_ >> 0x20) / fVar17;
      fVar16 = state.camera.camera_front.field_0.field_0.b / fVar17;
    }
    else {
      fVar18 = 0.0;
      fVar19 = 0.0;
    }
    state.camera.camera_front.field_0._0_8_ = CONCAT44(fVar19,fVar18);
    state.camera.camera_front.field_0.field_0.b = fVar16;
    dVar1 = glfwGetTime();
    dVar2 = (double)state.last_frame;
    state.last_frame = (float)dVar1;
    state.delta_time = (float)(dVar1 - dVar2);
    if (state.first_frame == true) {
      state.delta_time = 0.0;
      state.first_frame = false;
    }
    iVar8 = glfwGetKey((GLFWwindow *)auVar4,0x57);
    if (iVar8 == 1) {
      state.camera.camera_pos.field_0.field_0.b =
           state.delta_time * state.camera.camera_front.field_0.field_0.b * 0.6 +
           state.camera.camera_pos.field_0.field_0.b;
      state.camera.camera_pos.field_0._0_8_ =
           CONCAT44((float)((ulong)state.camera.camera_front.field_0._0_8_ >> 0x20) *
                    state.delta_time * 0.6 + state.camera.camera_pos.field_0.field_0.g,
                    (float)state.camera.camera_front.field_0._0_8_ * state.delta_time * 0.6 +
                    state.camera.camera_pos.field_0.field_0.r);
    }
    iVar8 = glfwGetKey((GLFWwindow *)auVar4,0x53);
    if (iVar8 == 1) {
      state.camera.camera_pos.field_0.field_0.b =
           state.camera.camera_pos.field_0.field_0.b -
           state.delta_time * state.camera.camera_front.field_0.field_0.b * 0.6;
      state.camera.camera_pos.field_0._0_8_ =
           CONCAT44(state.camera.camera_pos.field_0.field_0.g -
                    (float)((ulong)state.camera.camera_front.field_0._0_8_ >> 0x20) *
                    state.delta_time * 0.6,
                    state.camera.camera_pos.field_0.field_0.r -
                    (float)state.camera.camera_front.field_0._0_8_ * state.delta_time * 0.6);
    }
    poVar14 = (ostream *)0x50;
    iVar8 = glfwGetKey((GLFWwindow *)auVar4,0x50);
    if (iVar8 == 1) {
      vec.field_0.field_0.b = state.camera.camera_pos.field_0.field_0.b;
      vec.field_0._0_8_ = state.camera.camera_pos.field_0._0_8_;
      poVar14 = FMath::operator<<((FMath *)&std::cout,poVar14,vec);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
    }
    std::chrono::_V2::steady_clock::now();
    glfwPollEvents();
    glfwSwapBuffers((GLFWwindow *)local_100);
  }
  (*glad_glDeleteProgram)(render.vbo_offset);
  (*glad_glDeleteProgram)(render.shader_program.vertex_shader);
  (*glad_glDeleteProgram)(render.light_cube_shader_program.vertex_shader);
  Render::DestroyRenderer((Renderer *)local_100);
  if (floorModel.meshes.super__Vector_base<Mesh,_std::allocator<Mesh>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)&floorModel.directory._M_string_length)
  {
    uStack_480 = 0x10b7d5;
    operator_delete(floorModel.meshes.super__Vector_base<Mesh,_std::allocator<Mesh>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    floorModel.directory._M_string_length + 1);
  }
  uStack_480 = 0x10b7e1;
  std::vector<Mesh,_std::allocator<Mesh>_>::~vector
            ((vector<Mesh,_std::allocator<Mesh>_> *)
             &floorModel.textures_loaded.super__Vector_base<Texture,_std::allocator<Texture>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  uStack_480 = 0x10b7ed;
  std::vector<Texture,_std::allocator<Texture>_>::~vector
            ((vector<Texture,_std::allocator<Texture>_> *)((long)&mainModel.directory.field_2 + 8));
  if (mainModel.meshes.super__Vector_base<Mesh,_std::allocator<Mesh>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)&mainModel.directory._M_string_length) {
    uStack_480 = 0x10b80c;
    operator_delete(mainModel.meshes.super__Vector_base<Mesh,_std::allocator<Mesh>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    mainModel.directory._M_string_length + 1);
  }
  uStack_480 = 0x10b818;
  std::vector<Mesh,_std::allocator<Mesh>_>::~vector
            ((vector<Mesh,_std::allocator<Mesh>_> *)
             &mainModel.textures_loaded.super__Vector_base<Texture,_std::allocator<Texture>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  uStack_480 = 0x10b824;
  std::vector<Texture,_std::allocator<Texture>_>::~vector
            ((vector<Texture,_std::allocator<Texture>_> *)local_368);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  auto render = Render::CreateRenderer(state.screen_width,state.screen_height);
  render.shader_program = ShaderProgram("./shader/model-vertex.glsl", "./shader/model-fragment.glsl");
  
  render.light_cube_shader_program = ShaderProgram("./shader/light-cube-vertex.glsl","./shader/light-cube-fragment.glsl");
  render.skybox_shader_program = ShaderProgram("./shader/skybox-vertex.glsl","./shader/skybox-fragment.glsl");

  stbi_set_flip_vertically_on_load(true);

  //Model mainModel("./models/cyborg/cyborg.obj");
  //Model mainModel("./models/rocket/rocket.obj");
  //  Model mainModel("./Models/cubie/cubie.obj");
   Model mainModel("./Models/Final/rocket.obj");
  //Model mainModel("./models/backpack/backpack.obj");
   Model floorModel("./Models/Final/Floor/floor.obj");
  
  FMath::Vec3<float> cube_positions[] = {
      //FMath::Vec3(0.6964f,  1.666f, 0.706876f),
      //FMath::Vec3(1.06075f, 1.01993f, -0.6604f),
      //FMath::Vec3(1.1641f, 1.01472f, 1.03914f),


      FMath::Vec3(2.19173f, 1.93018f, 2.25142f),
      FMath::Vec3(2.15991f, 1.89708f, -1.57857f),
      FMath::Vec3(1.32463f, 5.01879f, 2.60398f),
      FMath::Vec3(-0.746886f, 1.90037f, 2.15353f),
      FMath::Vec3(-0.705121f, 1.94047f, -1.54101f),

      // Lighting for four corners
      FMath::Vec3(6.0f,0.45f,-6.0f),
      FMath::Vec3(-6.0f,0.45f,6.0f),
      FMath::Vec3(-6.0f,0.45f,-6.0f),
      FMath::Vec3(6.0f,0.45f,6.0f),
  };

  
  FMath::Vec3<float> cube_colors[] = {
      //FMath::Vec3(1.0f, 1.0f, 1.0f),
      //FMath::Vec3(0.498f, 1.000f, 0.831f),
      //FMath::Vec3(0.863f, 0.078f, 0.235f),
      //FMath::Vec3(1.000f, 0.843f, 0.000f),
      
      FMath::Vec3(1.0f, 1.0f, 1.0f),
      FMath::Vec3(0.0f, 0.2f, 0.0f),
      FMath::Vec3(1.0f, 1.0f, 1.0f),
      FMath::Vec3(1.0f, 0.0f, 0.0f),
      FMath::Vec3(1.0f, 1.0f, 1.0f),

      FMath::Vec3(1.0f,0.0f,1.0f),
      FMath::Vec3(1.0f,0.0f,0.0f),
      FMath::Vec3(0.0f,0.0f,1.0f),
      FMath::Vec3(1.0f,1.0f,0.0f)
  };
  int NR_LIGHT_CUBES = sizeof(cube_positions) / (3 * sizeof(float));

  Cube cubes[NR_LIGHT_CUBES];
  for (int i = 0; i < NR_LIGHT_CUBES; i++){
    cubes[i].position = cube_positions[i];
    cubes[i].scale = FMath::Vec3<float>(0.08f, 0.08f, 0.08f);
    cubes[i].color = cube_colors[i];
  }

  // Manual depth buffering
  auto zrender = Render::ZRender(state.screen_width,state.screen_height);
  auto zprogram = glCreateProgram();
  auto zvertex  = CompileAndLogShader("./shader/zvertex.glsl",GL_VERTEX_SHADER);
  glAttachShader(zprogram,zvertex);
  zrender.attachDepthFragment(zprogram);
  
  
  const char* skybox_textures[6] = {
    "./resources/skybox/right.png",
    "./resources/skybox/left.png",
    "./resources/skybox/top.png",
    "./resources/skybox/bottom.png",
    "./resources/skybox/back.png",
    "./resources/skybox/front.png"
  };
  SkyBox skybox;
  skybox.load_skybox_textures(skybox_textures);
  glUseProgram(render.skybox_shader_program.shader_program);
  update_uniform_1i("skybox", render.skybox_shader_program.shader_program, 0);

  // glEnable(GL_DEPTH_TEST);

  //std::cout << "Width " << state.screen_width << " Height -> " << state.screen_height << std::endl;
  // pre-main loop optimization
  FMath::Mat4 model(1.0f), inverse_model(1.0f);
  model = model.translate({0.0f, 0.0f, 0.0f});
  model = model.scale({0.2f, 0.2f, 0.2});
  inverse_model = inverse_model.model_mat_inverse(model);
  inverse_model = inverse_model.transpose();

  // projection matrix does not change for us since it is only first person view
  FMath::Mat4 projection(1.0f);
  projection = projection.perspective(1.0f, 30.0f,0.01f,100.0f); // 30 degrees so 30.0f

  // auto project = glm::perspective(glm::radians(30.0f),1.0f,0.1f,10.0f);

  glEnable(GL_CULL_FACE);
  auto now = std::chrono::steady_clock::now();
  auto then = now;

  FMath::Vec3<float> atten_vec[9] =
    {
      FMath::Vec3(1.0f,0.44f,0.35f),
      FMath::Vec3(1.0f,0.44f,0.35f),
      FMath::Vec3(1.0f,0.44f,0.35f),
      FMath::Vec3(1.0f,0.44f,0.35f),
      FMath::Vec3(1.0f,0.44f,0.35f),
      
      FMath::Vec3(0.1f,0.1f,0.1f),
      FMath::Vec3(0.1f,0.1f,0.1f),
      FMath::Vec3(0.1f,0.1f,0.1f),
      FMath::Vec3(0.1f,0.1f,0.1f)
    };
      
  
  while (!glfwWindowShouldClose(render.window)) {


    zrender.clearBG(0.25f,0.25f,0.25f,1.0f);
    zrender.clearDepth();

    glUseProgram(render.shader_program.shader_program);
    FMath::Mat4 view(1.0f), cube_model(1.0f);

    view = state.camera.ViewMatrix();

    update_uniform_3f("viewPos", render.shader_program.shader_program,
                      state.camera.camera_pos);
    for (int i = 0; i < NR_LIGHT_CUBES; i++) {
      update_uniform_3f(
          std::string("light[" + std::to_string(i) + "].position").c_str(),
          render.shader_program.shader_program, cubes[i].position);

      update_uniform_3f(std::string("light[" + std::to_string(i) + "].ambient").c_str(), render.shader_program.shader_program,
                        ambient(cubes[i].color));
      update_uniform_3f(std::string("light[" + std::to_string(i) + "].diffuse").c_str(), render.shader_program.shader_program,
                        diffuse(cubes[i].color));
      update_uniform_3f(std::string("light[" + std::to_string(i) + "].specular").c_str(), render.shader_program.shader_program,
                        specular(cubes[i].color));

      // TODO: maybe use default values for this one? just an optimization thought
      // update_uniform_1f(std::string("light[" + std::to_string(i) + "].constantAtten").c_str(),
      //                   render.shader_program.shader_program, 1.0f);
      // update_uniform_1f(std::string("light[" + std::to_string(i) + "].linearAtten").c_str(),
      //                   render.shader_program.shader_program, 0.35f);
      // update_uniform_1f(std::string("light[" + std::to_string(i) + "].quadraticAtten").c_str(),
      //                   render.shader_program.shader_program, 0.44f);

      update_uniform_1f(std::string("light[" + std::to_string(i) + "].constantAtten").c_str(),
                        render.shader_program.shader_program, atten_vec[i].x);
      update_uniform_1f(std::string("light[" + std::to_string(i) + "].linearAtten").c_str(),
                        render.shader_program.shader_program, atten_vec[i].y);
      update_uniform_1f(std::string("light[" + std::to_string(i) + "].quadraticAtten").c_str(),
                        render.shader_program.shader_program, atten_vec[i].z);

    }


    glUseProgram(render.shader_program.shader_program);
    update_uniform_matrix_4f("model", render.shader_program.shader_program, &model[0][0]);
    update_uniform_matrix_4f("inv_model", render.shader_program.shader_program, &inverse_model[0][0]);
    update_uniform_matrix_4f("projection", render.shader_program.shader_program,projection.value_ptr());
    update_uniform_matrix_4f("view", render.shader_program.shader_program, &view[0][0]);

    
    glUseProgram(zprogram);
    update_uniform_matrix_4f("model", zprogram, model.value_ptr());
    update_uniform_matrix_4f("projection", zprogram, projection.value_ptr());//projection.value_ptr());
    update_uniform_matrix_4f("view", zprogram, view.value_ptr());
    
    


    glUseProgram(render.skybox_shader_program.shader_program);



    update_uniform_matrix_4f("projection", render.skybox_shader_program.shader_program, &projection[0][0]);
    update_uniform_matrix_4f("view", render.skybox_shader_program.shader_program, &view[0][0]);

    glBindFramebuffer(GL_FRAMEBUFFER,zrender.colorFBO);
    skybox.draw_skybox();
    
    glUseProgram(zprogram);

    zrender.clearDepth();
     
    // zrender.clearDepth();
    // // mainModel.draw_model(render.shader_program.shader_program);

    //  modal.draw_model(render.shader_program.shader_program,zprogram,zrender);
    mainModel.draw_model(render.shader_program.shader_program,zprogram,zrender);
    // update_uniform_matrix_4f("model", zprogram, model.scale({5.0f,1.0f,5.0f}).value_ptr());
    floorModel.draw_model(render.shader_program.shader_program,zprogram,zrender);
    // // // light cube render
    // // glUseProgram(render.light_cube_shader_program.shader_program);
    // // update_uniform_matrix_4f("projection", render.light_cube_shader_program.shader_program, &projection[0][0]);
    // // update_uniform_matrix_4f("view", render.light_cube_shader_program.shader_program, &view[0][0]);

    // // // TODO: use instanced cubes
    // // glBindVertexArray(cubes[0].VAO);
    // // for (int i = 0; i < NR_LIGHT_CUBES; i++){
    // //   cube_model = FMath::Mat4<float>(1.0f);
    // //   cube_model = cube_model.translate(cubes[i].position);
    // //   cube_model = cube_model.scale(cubes[i].scale);

    // //   update_uniform_3f("cubeColor", render.light_cube_shader_program.shader_program, cubes[i].color);
    // //   update_uniform_matrix_4f("model", render.light_cube_shader_program.shader_program, &cube_model[0][0]);
    // //   glDrawArrays(GL_TRIANGLES, 0, 36);
    // // }
    
    zrender.draw();

    handleEvents(render.window);
    now = std::chrono::steady_clock::now();
    //std::cout << "FPS is -> " << 1000.0f/std::chrono::duration_cast<std::chrono::milliseconds>(now-then).count() << std::endl;
    then = now;
    glfwPollEvents();
    glfwSwapBuffers(render.window);
  }

  glDeleteProgram(render.shader_program.shader_program);
  glDeleteProgram(render.light_cube_shader_program.shader_program);
  glDeleteProgram(render.skybox_shader_program.shader_program);
  Render::DestroyRenderer(&render);
  return 0;
}